

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

SDL_Surface * GPU_LoadSurface_RW(SDL_RWops *rwops,_Bool free_rwops)

{
  SDL_Palette *pSVar1;
  undefined1 uVar2;
  int len;
  stbi_uc *psVar3;
  stbi_uc *retval_from_stbi_load;
  SDL_Surface *pSVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  int channels;
  int height;
  int width;
  undefined1 local_438 [1032];
  
  if (rwops == (SDL_RWops *)0x0) {
    pSVar4 = (SDL_Surface *)0x0;
    GPU_PushErrorCode("GPU_LoadSurface_RW",GPU_ERROR_NULL_ARGUMENT,"rwops");
  }
  else {
    SDL_RWseek(rwops,0,0);
    len = SDL_RWseek(rwops,0,2);
    SDL_RWseek(rwops,0,0);
    psVar3 = (stbi_uc *)SDL_malloc((long)len);
    SDL_RWread(rwops,psVar3,1,(long)len);
    retval_from_stbi_load = stbi_load_from_memory(psVar3,len,&width,&height,&channels,0);
    SDL_free(psVar3);
    if (free_rwops) {
      SDL_RWclose(rwops);
    }
    if (retval_from_stbi_load == (stbi_uc *)0x0) {
      pcVar6 = stbi_failure_reason();
      pSVar4 = (SDL_Surface *)0x0;
      GPU_PushErrorCode("GPU_LoadSurface_RW",GPU_ERROR_DATA_ERROR,"Failed to load from rwops: %s",
                        pcVar6);
    }
    else {
      if (channels - 1U < 4) {
        uVar7 = (ulong)(channels - 1U);
        pSVar4 = (SDL_Surface *)
                 SDL_CreateRGBSurface
                           (0,width,(ulong)(uint)height,channels * 8,
                            *(undefined4 *)(&DAT_001b72a0 + uVar7 * 4),
                            *(undefined4 *)(&DAT_001b72b0 + uVar7 * 4),
                            *(undefined4 *)(&DAT_001b72c0 + uVar7 * 4),
                            *(undefined4 *)(&DAT_001b72d0 + uVar7 * 4));
        if (pSVar4 == (SDL_Surface *)0x0) {
          pSVar4 = (SDL_Surface *)0x0;
          GPU_PushErrorCode("gpu_copy_raw_surface_data",GPU_ERROR_DATA_ERROR,
                            "Failed to create new %dx%d surface",(ulong)(uint)width,
                            (ulong)(uint)height);
        }
        else {
          if (0 < height) {
            uVar7 = 0;
            psVar3 = retval_from_stbi_load;
            do {
              memcpy((void *)((long)pSVar4->pitch * uVar7 + (long)pSVar4->pixels),psVar3,
                     (long)(channels * width));
              uVar7 = uVar7 + 1;
              psVar3 = psVar3 + channels * width;
            } while ((uint)height != uVar7);
          }
          pSVar1 = pSVar4->format->palette;
          if (pSVar1 != (SDL_Palette *)0x0) {
            lVar5 = 0;
            do {
              uVar2 = (undefined1)lVar5;
              local_438[lVar5 * 4 + 2] = uVar2;
              local_438[lVar5 * 4 + 1] = uVar2;
              local_438[lVar5 * 4] = uVar2;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x100);
            SDL_SetPaletteColors(pSVar1,local_438,0,0x100);
          }
        }
      }
      else {
        pSVar4 = (SDL_Surface *)0x0;
        GPU_PushErrorCode("gpu_copy_raw_surface_data",GPU_ERROR_DATA_ERROR,
                          "Invalid number of channels: %d",(ulong)(uint)channels);
      }
      stbi_image_free(retval_from_stbi_load);
    }
  }
  return pSVar4;
}

Assistant:

SDL_Surface* GPU_LoadSurface_RW(SDL_RWops* rwops, GPU_bool free_rwops)
{
    int width, height, channels;
    unsigned char* data;
    SDL_Surface* result;
    
    int data_bytes;
    unsigned char* c_data;

    if(rwops == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_NULL_ARGUMENT, "rwops");
        return NULL;
    }

    // Get count of bytes
    SDL_RWseek(rwops, 0, SEEK_SET);
    data_bytes = (int)SDL_RWseek(rwops, 0, SEEK_END);
    SDL_RWseek(rwops, 0, SEEK_SET);
    
    // Read in the rwops data
    c_data = (unsigned char*)SDL_malloc(data_bytes);
    SDL_RWread(rwops, c_data, 1, data_bytes);
    
    // Load image
    data = stbi_load_from_memory(c_data, data_bytes, &width, &height, &channels, 0);
    
    // Clean up temp data
    SDL_free(c_data);
    if(free_rwops)
        SDL_RWclose(rwops);

    if(data == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Failed to load from rwops: %s", stbi_failure_reason());
        return NULL;
    }

    // Copy into a surface
    result = gpu_copy_raw_surface_data(data, width, height, channels);

    stbi_image_free(data);

    return result;
}